

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

int smooth_(int *n,double *x,double *y,double *w,double *span,int *iper,double *vsmlsq,double *smo,
           double *acvr)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  
  iVar6 = iabs(*iper);
  uVar4 = *n;
  uVar7 = (ulong)uVar4;
  uVar8 = (uint)((double)(int)uVar4 * *span * 0.5 + 0.5);
  uVar11 = 2;
  if (2 < (int)uVar8) {
    uVar11 = uVar8;
  }
  if ((int)(uVar11 * 2) < 0) {
    dVar23 = 0.0;
    dVar19 = 0.0;
    dVar22 = 0.0;
    dVar20 = 0.0;
    dVar26 = 0.0;
  }
  else {
    uVar8 = 0;
    if (iVar6 == 2) {
      uVar8 = ~uVar11;
    }
    iVar13 = uVar8 + uVar4;
    lVar10 = (ulong)(uVar11 * 2) + 1;
    iVar17 = 1;
    dVar26 = 0.0;
    dVar20 = 0.0;
    dVar19 = 0.0;
    dVar23 = 0.0;
    dVar24 = 0.0;
    lVar14 = (long)(int)uVar8;
    do {
      iVar13 = iVar13 + 1;
      if (lVar14 + 1 < 1) {
        dVar28 = x[(int)uVar4 + lVar14] + -1.0;
        iVar15 = iVar13;
      }
      else {
        dVar28 = x[lVar14];
        iVar15 = uVar8 + iVar17;
      }
      dVar2 = w[(long)iVar15 + -1];
      dVar22 = dVar24 + dVar2;
      if (0.0 < dVar22) {
        dVar19 = (dVar19 * dVar24 + dVar2 * y[(long)iVar15 + -1]) / dVar22;
      }
      dVar23 = (double)(~-(ulong)(0.0 < dVar22) & (ulong)dVar23 |
                       (ulong)((dVar24 * dVar23 + dVar28 * dVar2) / dVar22) & -(ulong)(0.0 < dVar22)
                       );
      dVar24 = (double)(-(ulong)(0.0 < dVar24) &
                       (ulong)((dVar2 * dVar22 * (dVar28 - dVar23)) / dVar24));
      dVar20 = dVar20 + (dVar28 - dVar23) * dVar24;
      dVar26 = dVar26 + (y[(long)iVar15 + -1] - dVar19) * dVar24;
      iVar17 = iVar17 + 1;
      lVar10 = lVar10 + -1;
      dVar24 = dVar22;
      lVar14 = lVar14 + 1;
    } while (lVar10 != 0);
  }
  uVar18 = (long)(int)uVar4;
  if (0 < (int)uVar4) {
    iVar13 = *iper;
    uVar12 = (ulong)uVar11;
    lVar14 = (long)(int)-uVar11;
    iVar17 = 1;
    uVar16 = 0;
    do {
      iVar15 = iVar17 + uVar11;
      uVar18 = uVar16 + uVar12 + 1;
      if (iVar6 == 2) {
        if ((long)(lVar14 + uVar16) < 1) {
          iVar9 = (uVar4 - uVar11) + (int)uVar16;
          dVar24 = x[lVar14 + uVar7 + (uVar16 - 1)] + -1.0;
LAB_00133186:
          dVar28 = x[uVar12 + uVar16];
        }
        else {
LAB_0013314b:
          iVar9 = ~uVar11 + iVar17;
          if (uVar18 <= uVar7) {
            dVar24 = x[lVar14 + (uVar16 - 1)];
            goto LAB_00133186;
          }
          iVar15 = (uVar11 - uVar4) + 1 + (int)uVar16;
          dVar28 = x[(uVar12 + uVar16) - uVar7] + 1.0;
          dVar24 = x[lVar14 + (uVar16 - 1)];
        }
        dVar2 = w[(long)iVar9 + -1];
        dVar21 = dVar22 - dVar2;
        dVar25 = dVar23;
        dVar29 = dVar19;
        if (0.0 < dVar21) {
          dVar25 = (dVar22 * dVar23 - dVar24 * dVar2) / dVar21;
          dVar29 = (dVar22 * dVar19 - y[(long)iVar9 + -1] * dVar2) / dVar21;
        }
        dVar3 = w[(long)iVar15 + -1];
        dVar27 = dVar21 + dVar3;
        if (0.0 < dVar27) {
          dVar29 = (dVar29 * dVar21 + dVar3 * y[(long)iVar15 + -1]) / dVar27;
        }
        dVar24 = dVar24 - dVar23;
        dVar23 = (double)(~-(ulong)(0.0 < dVar27) & (ulong)dVar25 |
                         (ulong)((dVar21 * dVar25 + dVar28 * dVar3) / dVar27) &
                         -(ulong)(0.0 < dVar27));
        uVar18 = -(ulong)(0.0 < dVar21);
        dVar25 = (double)((ulong)((dVar3 * dVar27 * (dVar28 - dVar23)) / dVar21) & uVar18);
        dVar22 = (double)(~uVar18 & 0x8000000000000000 |
                         (ulong)((dVar2 * -dVar22 * dVar24) / dVar21) & uVar18);
        dVar20 = (dVar28 - dVar23) * dVar25 + dVar24 * dVar22 + dVar20;
        dVar26 = (y[(long)iVar15 + -1] - dVar29) * dVar25 +
                 (y[(long)iVar9 + -1] - dVar19) * dVar22 + dVar26;
        dVar19 = dVar29;
        dVar22 = dVar27;
      }
      else if ((0 < (long)(lVar14 + uVar16)) && (uVar18 <= uVar7)) goto LAB_0013314b;
      uVar1 = uVar16 + 1;
      smo[uVar16] = (x[uVar16] - dVar23) *
                    (double)(-(ulong)(*vsmlsq < dVar20) & (ulong)(dVar26 / dVar20)) + dVar19;
      if (0 < iVar13) {
        dVar24 = (double)(-(ulong)(0.0 < dVar22) & (ulong)(1.0 / dVar22));
        if (*vsmlsq <= dVar20 && dVar20 != *vsmlsq) {
          dVar24 = dVar24 + ((x[uVar16] - dVar23) * (x[uVar16] - dVar23)) / dVar20;
        }
        acvr[uVar16] = 0.0;
        dVar24 = 1.0 - dVar24 * w[uVar16];
        if (dVar24 <= 0.0) {
          if (uVar1 < 2) goto LAB_001333e9;
          dVar24 = acvr[uVar16 - 1];
        }
        else {
          dVar24 = ABS(y[uVar16] - smo[uVar16]) / dVar24;
        }
        acvr[uVar16] = dVar24;
      }
LAB_001333e9:
      iVar17 = iVar17 + 1;
      uVar18 = uVar7;
      uVar16 = uVar1;
    } while (uVar7 != uVar1);
  }
  uVar11 = 1;
  do {
    uVar8 = uVar11;
    if ((int)uVar11 < (int)uVar4) {
      lVar14 = (long)(int)uVar11;
      dVar19 = w[lVar14 + -1];
      dVar26 = smo[lVar14 + -1] * dVar19;
      lVar10 = 0;
      dVar22 = x[lVar14 + -1];
      do {
        lVar5 = lVar14 + lVar10;
        if (dVar22 < x[lVar5]) {
          uVar8 = (int)lVar10 + uVar11;
          break;
        }
        dVar26 = dVar26 + smo[lVar14 + lVar10] * w[lVar14 + lVar10];
        dVar19 = dVar19 + w[lVar14 + lVar10];
        lVar10 = lVar10 + 1;
        dVar22 = x[lVar5];
        uVar8 = uVar4;
      } while (uVar18 - lVar14 != lVar10);
      if ((int)uVar11 < (int)uVar8) {
        lVar10 = -1;
        do {
          smo[lVar14 + lVar10] = (double)(-(ulong)(0.0 < dVar19) & (ulong)(dVar26 / dVar19));
          lVar10 = lVar10 + 1;
        } while (uVar8 - uVar11 != (int)lVar10);
      }
    }
    uVar11 = uVar8 + 1;
    if ((int)uVar4 <= (int)uVar8) {
      return uVar11;
    }
  } while( true );
}

Assistant:

static int smooth_(int *n, double *x, double *y, double *w, double *span, int *iper, double *vsmlsq, double *smo, double *acvr)
{
    /* System generated locals */
    int i__1;
    double r__1;
    double d__1;

    /* Local variables */
    double a, h__;
    int i__, j, j0, in, it;
    double xm, ym, wt, sy, fbo, fbw;
    int ibw;
    double var, tmp;
    double xti;
    int out;
    double xto;
    double cvar;
    int jper;

    /* Parameter adjustments */
    --acvr;
    --smo;
    --w;
    --y;
    --x;

    /* Function Body */
    xm = 0.f;
    ym = xm;
    var = ym;
    cvar = var;
    fbw = cvar;
    jper = iabs(*iper);
    ibw = *span * .5 * *n + .5;
    if (ibw < 2) {
	ibw = 2;
    }
    it = (ibw << 1) + 1;
    i__1 = it;
    for (i__ = 1; i__ <= i__1; ++i__) {
	j = i__;
	if (jper == 2) {
	    j = i__ - ibw - 1;
	}
	xti = x[j];
	if (j >= 1) {
	    goto L10;
	}
	j = *n + j;
	xti = x[j] - 1.0;
L10:
	wt = w[j];
	fbo = fbw;
	fbw += wt;
	if (fbw > 0.0) {
	    xm = (fbo * xm + wt * xti) / fbw;
	}
	if (fbw > 0.0) {
	    ym = (fbo * ym + wt * y[j]) / fbw;
	}
	tmp = 0.0;
	if (fbo > 0.0) {
	    tmp = fbw * wt * (xti - xm) / fbo;
	}
	var += tmp * (xti - xm);
	cvar += tmp * (y[j] - ym);
/* L20: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	out = j - ibw - 1;
	in = j + ibw;
	if (jper != 2 && (out < 1 || in > *n)) {
	    goto L60;
	}
	if (out >= 1) {
	    goto L30;
	}
	out = *n + out;
	xto = x[out] - 1.0;
	xti = x[in];
	goto L50;
L30:
	if (in <= *n) {
	    goto L40;
	}
	in -= *n;
	xti = x[in] + 1.0;
	xto = x[out];
	goto L50;
L40:
	xto = x[out];
	xti = x[in];
L50:
	wt = w[out];
	fbo = fbw;
	fbw -= wt;
	tmp = 0.0;
	if (fbw > 0.0) {
	    tmp = fbo * wt * (xto - xm) / fbw;
	}
	var -= tmp * (xto - xm);
	cvar -= tmp * (y[out] - ym);
	if (fbw > 0.0) {
	    xm = (fbo * xm - wt * xto) / fbw;
	}
	if (fbw > 0.0) {
	    ym = (fbo * ym - wt * y[out]) / fbw;
	}
	wt = w[in];
	fbo = fbw;
	fbw += wt;
	if (fbw > 0.0) {
	    xm = (fbo * xm + wt * xti) / fbw;
	}
	if (fbw > 0.0) {
	    ym = (fbo * ym + wt * y[in]) / fbw;
	}
	tmp = 0.0;
	if (fbo > 0.0) {
	    tmp = fbw * wt * (xti - xm) / fbo;
	}
	var += tmp * (xti - xm);
	cvar += tmp * (y[in] - ym);
L60:
	a = 0.0;
	if (var > *vsmlsq) {
	    a = cvar / var;
	}
	smo[j] = a * (x[j] - xm) + ym;
	if (*iper <= 0) {
	    goto L80;
	}
	h__ = 0.0;
	if (fbw > 0.0) {
	    h__ = 1.0 / fbw;
	}
	if (var > *vsmlsq) {
/* Computing 2nd power */
	    d__1 = x[j] - xm;
	    h__ += d__1 * d__1 / var;
	}
	acvr[j] = 0.0;
	a = 1.0 - w[j] * h__;
	if (a <= 0.0) {
	    goto L70;
	}
	acvr[j] = (r__1 = y[j] - smo[j], fabs(r__1)) / a;
	goto L80;
L70:
	if (j <= 1) {
	    goto L80;
	}
	acvr[j] = acvr[j - 1];
L80:
	;
    }
    j = 1;
L90:
    j0 = j;
    sy = smo[j] * w[j];
    fbw = w[j];
    if (j >= *n) {
	goto L110;
    }
L100:
    if (x[j + 1] > x[j]) {
	goto L110;
    }
    ++j;
    sy += w[j] * smo[j];
    fbw += w[j];
    if (j < *n) {
	goto L100;
    }
L110:
    if (j <= j0) {
	goto L130;
    }
    a = 0.0;
    if (fbw > 0.0) {
	a = sy / fbw;
    }
    i__1 = j;
    for (i__ = j0; i__ <= i__1; ++i__) {
	smo[i__] = a;
/* L120: */
    }
L130:
    ++j;
    if (j <= *n) {
	goto L90;
    }
    return 0;
}